

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmTst<(moira::Instr)128,(moira::Mode)11,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  char cVar3;
  long lVar4;
  Ea<(moira::Mode)11,_2> ea;
  u32 local_1c;
  ushort local_18;
  uint local_14;
  
  local_18 = op & 7;
  local_1c = *addr;
  *addr = local_1c + 2;
  local_14 = (*this->_vptr_Moira[6])();
  local_14 = local_14 & 0xffff;
  cVar3 = 't';
  lVar4 = 1;
  do {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar3;
    cVar3 = "btst"[lVar4 + 1];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  if (str->style->syntax - MOIRA_MIT < 3) {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = 'w';
  }
  else {
    cVar3 = '.';
    lVar4 = 0;
    do {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar3;
      cVar3 = "$%x.w"[lVar4 + 4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 2);
  }
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = ' ';
  }
  else {
    iVar1 = (str->tab).raw;
    do {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = ' ';
    } while (str->ptr < str->base + iVar1);
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)11,_2> *)&local_1c);
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar3 = ';';
    lVar4 = 1;
    do {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar3;
      cVar3 = "trap%-2s  ; (2+)"[lVar4 + 10];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 7);
  }
  return;
}

Assistant:

void
Moira::dasmTst(StrWriter &str, u32 &addr, u16 op) const
{
    auto ea = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << str.tab << ea;
    str << Av<I, M, S>{};
}